

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_ObjComputeLevelD(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  int local_2c;
  int local_28;
  int Level;
  int k;
  int iFanin;
  int *pFanins;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  local_2c = 0;
  local_28 = 0;
  piVar2 = Acb_ObjFanins(p,iObj);
  for (; local_28 < *piVar2; local_28 = local_28 + 1) {
    iVar1 = Acb_ObjLevelD(p,piVar2[local_28 + 1]);
    local_2c = Abc_MaxInt(local_2c,iVar1);
  }
  iVar1 = Acb_ObjIsCio(p,iObj);
  iVar1 = Acb_ObjSetLevelD(p,iObj,local_2c + (uint)((iVar1 != 0 ^ 0xffU) & 1));
  return iVar1;
}

Assistant:

int Acb_ObjComputeLevelD( Acb_Ntk_t * p, int iObj )
{
    int * pFanins, iFanin, k, Level = 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Level = Abc_MaxInt( Level, Acb_ObjLevelD(p, iFanin) );
    return Acb_ObjSetLevelD( p, iObj, Level + !Acb_ObjIsCio(p, iObj) );
}